

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  ulong uVar8;
  float **ppfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  Geometry *pGVar13;
  Geometry *pGVar14;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 (*pauVar20) [16];
  long lVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  float *pfVar24;
  Geometry *pGVar25;
  Geometry *pGVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint *puVar30;
  long lVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  float fVar41;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint uVar50;
  undefined1 auVar46 [16];
  float fVar51;
  float fVar66;
  float fVar68;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar67;
  float fVar69;
  float fVar70;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  float fVar96;
  float fVar97;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar106;
  float fVar107;
  float fVar110;
  float fVar111;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar112;
  float fVar114;
  float fVar115;
  undefined1 auVar113 [16];
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar117 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1298;
  int local_127c;
  undefined8 local_1278;
  float fStack_1270;
  float fStack_126c;
  undefined8 local_1268;
  float fStack_1260;
  float fStack_125c;
  undefined8 local_1258;
  float fStack_1250;
  float fStack_124c;
  ulong local_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined1 local_1228 [8];
  undefined8 uStack_1220;
  undefined1 local_1218 [16];
  undefined8 local_1208;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  RayQueryContext *local_11e0;
  undefined8 local_11d8;
  float fStack_11d0;
  float fStack_11cc;
  undefined8 local_11c8;
  float fStack_11c0;
  float fStack_11bc;
  RTCFilterFunctionNArguments local_11b8;
  undefined8 local_1188;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  undefined4 local_1174;
  undefined4 local_1170;
  float local_116c;
  undefined4 local_1168;
  undefined4 local_1164;
  uint local_1160;
  uint local_115c;
  uint local_1158;
  Scene *local_1140;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined1 local_1108 [8];
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  undefined1 local_10d8 [16];
  float local_10c8 [4];
  undefined1 local_10b8 [8];
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [8];
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  float fStack_1060;
  float fStack_105c;
  long local_1058;
  long local_1050;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  uint local_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined8 local_fa8;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  float fStack_f80;
  float fStack_f7c;
  undefined8 local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar33 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar107 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar146 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar139 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar100 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar110 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fVar148 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fVar104 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fVar111 = (ray->super_RayK<1>).dir.field_0.m128[3];
    fVar150 = 0.0;
    if (0.0 <= fVar100) {
      fVar150 = fVar100;
    }
    fVar100 = (ray->super_RayK<1>).tfar;
    fVar143 = 0.0;
    if (0.0 <= fVar100) {
      fVar143 = fVar100;
    }
    uVar37 = -(uint)((float)DAT_01f4bd50 <= ABS(fVar110));
    uVar38 = -(uint)(DAT_01f4bd50._4_4_ <= ABS(fVar148));
    uVar39 = -(uint)(DAT_01f4bd50._8_4_ <= ABS(fVar104));
    uVar40 = -(uint)(DAT_01f4bd50._12_4_ <= ABS(fVar111));
    auVar52._0_4_ = (uint)fVar110 & uVar37;
    auVar52._4_4_ = (uint)fVar148 & uVar38;
    auVar52._8_4_ = (uint)fVar104 & uVar39;
    auVar52._12_4_ = (uint)fVar111 & uVar40;
    auVar81._0_4_ = ~uVar37 & (uint)(float)DAT_01f4bd50;
    auVar81._4_4_ = ~uVar38 & (uint)DAT_01f4bd50._4_4_;
    auVar81._8_4_ = ~uVar39 & (uint)DAT_01f4bd50._8_4_;
    auVar81._12_4_ = ~uVar40 & (uint)DAT_01f4bd50._12_4_;
    auVar81 = auVar81 | auVar52;
    auVar71 = rcpps(auVar52,auVar81);
    fVar129 = auVar71._0_4_;
    fVar130 = auVar71._4_4_;
    fVar131 = auVar71._8_4_;
    fVar129 = (1.0 - auVar81._0_4_ * fVar129) * fVar129 + fVar129;
    fVar130 = (1.0 - auVar81._4_4_ * fVar130) * fVar130 + fVar130;
    fVar131 = (1.0 - auVar81._8_4_ * fVar131) * fVar131 + fVar131;
    uVar32 = (ulong)(fVar129 < 0.0) << 4;
    uVar29 = (ulong)(fVar130 < 0.0) << 4 | 0x20;
    uVar27 = (ulong)(fVar131 < 0.0) << 4 | 0x40;
    uVar34 = uVar32 ^ 0x10;
    uVar28 = uVar29 ^ 0x10;
    auVar71._4_4_ = fVar143;
    auVar71._0_4_ = fVar143;
    auVar71._8_4_ = fVar143;
    auVar71._12_4_ = fVar143;
    _local_fd8 = mm_lookupmask_ps._240_8_;
    _uStack_fd0 = mm_lookupmask_ps._248_8_;
    local_11e0 = context;
    local_fe8 = fVar139;
    fStack_fe4 = fVar139;
    fStack_fe0 = fVar139;
    fStack_fdc = fVar139;
    local_ff8 = fVar150;
    fStack_ff4 = fVar150;
    fStack_ff0 = fVar150;
    fStack_fec = fVar150;
    local_1008 = fVar131;
    fStack_1004 = fVar131;
    fStack_1000 = fVar131;
    fStack_ffc = fVar131;
    local_1018 = fVar107;
    fStack_1014 = fVar107;
    fStack_1010 = fVar107;
    fStack_100c = fVar107;
    local_1028 = fVar146;
    fStack_1024 = fVar146;
    fStack_1020 = fVar146;
    fStack_101c = fVar146;
    local_1038 = fVar129;
    fStack_1034 = fVar129;
    fStack_1030 = fVar129;
    fStack_102c = fVar129;
    local_1048 = fVar130;
    fStack_1044 = fVar130;
    fStack_1040 = fVar130;
    fStack_103c = fVar130;
    local_1240 = uVar29;
    fVar100 = fVar139;
    fVar110 = fVar139;
    fVar148 = fVar139;
    fVar104 = fVar150;
    fVar111 = fVar150;
    fVar143 = fVar150;
    fVar152 = fVar131;
    fVar145 = fVar131;
    fVar105 = fVar131;
    fVar115 = fVar107;
    fVar106 = fVar107;
    fVar41 = fVar107;
    fVar47 = fVar146;
    fVar48 = fVar146;
    fVar49 = fVar146;
    fVar51 = fVar129;
    fVar66 = fVar129;
    fVar67 = fVar129;
    fVar68 = fVar130;
    fVar69 = fVar130;
    fVar70 = fVar130;
LAB_0057d0b4:
    if (pauVar33 != (undefined1 (*) [16])&local_f78) {
      pauVar20 = pauVar33 + -1;
      pauVar33 = pauVar33 + -1;
      pfVar6 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar20 + 8) < *pfVar6 || *(float *)((long)*pauVar20 + 8) == *pfVar6) {
        pauVar20 = (undefined1 (*) [16])&local_f78;
        pauVar35 = *(undefined1 (**) [16])*pauVar33;
        while (((ulong)pauVar35 & 8) == 0) {
          pfVar6 = (float *)((long)pauVar35[2] + uVar32);
          auVar102._0_4_ = (*pfVar6 - fVar107) * fVar129;
          auVar102._4_4_ = (pfVar6[1] - fVar115) * fVar51;
          auVar102._8_4_ = (pfVar6[2] - fVar106) * fVar66;
          auVar102._12_4_ = (pfVar6[3] - fVar41) * fVar67;
          pfVar6 = (float *)((long)pauVar35[2] + uVar29);
          auVar72._0_4_ = (*pfVar6 - fVar146) * fVar130;
          auVar72._4_4_ = (pfVar6[1] - fVar47) * fVar68;
          auVar72._8_4_ = (pfVar6[2] - fVar48) * fVar69;
          auVar72._12_4_ = (pfVar6[3] - fVar49) * fVar70;
          auVar52 = maxps(auVar102,auVar72);
          pfVar6 = (float *)((long)pauVar35[2] + uVar27);
          auVar73._0_4_ = (*pfVar6 - fVar139) * fVar131;
          auVar73._4_4_ = (pfVar6[1] - fVar100) * fVar152;
          auVar73._8_4_ = (pfVar6[2] - fVar110) * fVar145;
          auVar73._12_4_ = (pfVar6[3] - fVar148) * fVar105;
          auVar95._4_4_ = fVar104;
          auVar95._0_4_ = fVar150;
          auVar95._8_4_ = fVar111;
          auVar95._12_4_ = fVar143;
          auVar81 = maxps(auVar73,auVar95);
          _local_1128 = maxps(auVar52,auVar81);
          pfVar6 = (float *)((long)pauVar35[2] + uVar34);
          auVar74._0_4_ = (*pfVar6 - fVar107) * fVar129;
          auVar74._4_4_ = (pfVar6[1] - fVar115) * fVar51;
          auVar74._8_4_ = (pfVar6[2] - fVar106) * fVar66;
          auVar74._12_4_ = (pfVar6[3] - fVar41) * fVar67;
          pfVar6 = (float *)((long)pauVar35[2] + uVar28);
          auVar82._0_4_ = (*pfVar6 - fVar146) * fVar130;
          auVar82._4_4_ = (pfVar6[1] - fVar47) * fVar68;
          auVar82._8_4_ = (pfVar6[2] - fVar48) * fVar69;
          auVar82._12_4_ = (pfVar6[3] - fVar49) * fVar70;
          auVar52 = minps(auVar74,auVar82);
          pfVar6 = (float *)((long)pauVar35[2] + (uVar27 ^ 0x10));
          auVar83._0_4_ = (*pfVar6 - fVar139) * fVar131;
          auVar83._4_4_ = (pfVar6[1] - fVar100) * fVar152;
          auVar83._8_4_ = (pfVar6[2] - fVar110) * fVar145;
          auVar83._12_4_ = (pfVar6[3] - fVar148) * fVar105;
          auVar81 = minps(auVar83,auVar71);
          auVar52 = minps(auVar52,auVar81);
          auVar109._4_4_ = -(uint)(local_1128._4_4_ <= auVar52._4_4_);
          auVar109._0_4_ = -(uint)(local_1128._0_4_ <= auVar52._0_4_);
          auVar109._8_4_ = -(uint)(local_1128._8_4_ <= auVar52._8_4_);
          auVar109._12_4_ = -(uint)(local_1128._12_4_ <= auVar52._12_4_);
          uVar37 = movmskps((int)pauVar20,auVar109);
          if (uVar37 == 0) goto LAB_0057d0b4;
          uVar37 = uVar37 & 0xff;
          uVar36 = (ulong)pauVar35 & 0xfffffffffffffff0;
          lVar31 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
            }
          }
          pauVar20 = *(undefined1 (**) [16])(uVar36 + lVar31 * 8);
          uVar37 = uVar37 - 1 & uVar37;
          pauVar35 = pauVar20;
          if (uVar37 != 0) {
            uVar38 = *(uint *)(local_1128 + lVar31 * 4);
            lVar31 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
              }
            }
            pauVar35 = *(undefined1 (**) [16])(uVar36 + lVar31 * 8);
            uVar39 = *(uint *)(local_1128 + lVar31 * 4);
            uVar37 = uVar37 - 1 & uVar37;
            uVar29 = local_1240;
            if (uVar37 == 0) {
              if (uVar38 < uVar39) {
                *(undefined1 (**) [16])*pauVar33 = pauVar35;
                *(uint *)((long)*pauVar33 + 8) = uVar39;
                pauVar33 = pauVar33 + 1;
                pauVar35 = pauVar20;
              }
              else {
                *(undefined1 (**) [16])*pauVar33 = pauVar20;
                *(uint *)((long)*pauVar33 + 8) = uVar38;
                pauVar20 = pauVar35;
                pauVar33 = pauVar33 + 1;
              }
            }
            else {
              auVar53._8_4_ = uVar38;
              auVar53._0_8_ = pauVar20;
              auVar53._12_4_ = 0;
              auVar75._8_4_ = uVar39;
              auVar75._0_8_ = pauVar35;
              auVar75._12_4_ = 0;
              lVar31 = 0;
              if (uVar37 != 0) {
                for (; (uVar37 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                }
              }
              uVar8 = *(ulong *)(uVar36 + lVar31 * 8);
              iVar19 = *(int *)(local_1128 + lVar31 * 4);
              auVar84._8_4_ = iVar19;
              auVar84._0_8_ = uVar8;
              auVar84._12_4_ = 0;
              auVar92._8_4_ = -(uint)((int)uVar38 < (int)uVar39);
              uVar37 = uVar37 - 1 & uVar37;
              if (uVar37 == 0) {
                auVar92._4_4_ = auVar92._8_4_;
                auVar92._0_4_ = auVar92._8_4_;
                auVar92._12_4_ = auVar92._8_4_;
                auVar52 = auVar53 & auVar92 | ~auVar92 & auVar75;
                auVar81 = auVar75 & auVar92 | ~auVar92 & auVar53;
                auVar93._8_4_ = -(uint)(auVar52._8_4_ < iVar19);
                auVar93._0_8_ = CONCAT44(auVar93._8_4_,auVar93._8_4_);
                auVar93._12_4_ = auVar93._8_4_;
                pauVar20 = (undefined1 (*) [16])
                           (~auVar93._0_8_ & uVar8 | auVar52._0_8_ & auVar93._0_8_);
                auVar52 = auVar84 & auVar93 | ~auVar93 & auVar52;
                auVar54._8_4_ = -(uint)(auVar81._8_4_ < auVar52._8_4_);
                auVar54._4_4_ = auVar54._8_4_;
                auVar54._0_4_ = auVar54._8_4_;
                auVar54._12_4_ = auVar54._8_4_;
                *pauVar33 = ~auVar54 & auVar81 | auVar52 & auVar54;
                pauVar33[1] = auVar81 & auVar54 | ~auVar54 & auVar52;
                pauVar33 = pauVar33 + 2;
                pauVar35 = pauVar20;
              }
              else {
                lVar31 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                  }
                }
                iVar7 = *(int *)(local_1128 + lVar31 * 4);
                auVar101._8_4_ = iVar7;
                auVar101._0_8_ = *(undefined8 *)(uVar36 + lVar31 * 8);
                auVar101._12_4_ = 0;
                auVar94._4_4_ = auVar92._8_4_;
                auVar94._0_4_ = auVar92._8_4_;
                auVar94._8_4_ = auVar92._8_4_;
                auVar94._12_4_ = auVar92._8_4_;
                auVar52 = auVar53 & auVar94 | ~auVar94 & auVar75;
                auVar81 = auVar75 & auVar94 | ~auVar94 & auVar53;
                auVar108._0_4_ = -(uint)(iVar19 < iVar7);
                auVar108._4_4_ = -(uint)(iVar19 < iVar7);
                auVar108._8_4_ = -(uint)(iVar19 < iVar7);
                auVar108._12_4_ = -(uint)(iVar19 < iVar7);
                auVar95 = auVar84 & auVar108 | ~auVar108 & auVar101;
                auVar109 = ~auVar108 & auVar84 | auVar101 & auVar108;
                auVar85._8_4_ = -(uint)(auVar81._8_4_ < auVar109._8_4_);
                auVar85._4_4_ = auVar85._8_4_;
                auVar85._0_4_ = auVar85._8_4_;
                auVar85._12_4_ = auVar85._8_4_;
                auVar102 = auVar81 & auVar85 | ~auVar85 & auVar109;
                auVar76._8_4_ = -(uint)(auVar52._8_4_ < auVar95._8_4_);
                auVar76._0_8_ = CONCAT44(auVar76._8_4_,auVar76._8_4_);
                auVar76._12_4_ = auVar76._8_4_;
                pauVar20 = (undefined1 (*) [16])
                           (auVar52._0_8_ & auVar76._0_8_ | ~auVar76._0_8_ & auVar95._0_8_);
                auVar52 = ~auVar76 & auVar52 | auVar95 & auVar76;
                auVar55._8_4_ = -(uint)(auVar52._8_4_ < auVar102._8_4_);
                auVar55._4_4_ = auVar55._8_4_;
                auVar55._0_4_ = auVar55._8_4_;
                auVar55._12_4_ = auVar55._8_4_;
                *pauVar33 = ~auVar85 & auVar81 | auVar109 & auVar85;
                pauVar33[1] = ~auVar55 & auVar52 | auVar102 & auVar55;
                pauVar33[2] = auVar52 & auVar55 | ~auVar55 & auVar102;
                pauVar33 = pauVar33 + 3;
                pauVar35 = pauVar20;
              }
            }
          }
        }
        local_1058 = (ulong)((uint)pauVar35 & 0xf) - 8;
        for (local_1050 = 0; local_1050 != local_1058; local_1050 = local_1050 + 1) {
          lVar21 = local_1050 * 0x60;
          puVar1 = (uint *)(((ulong)pauVar35 & 0xfffffffffffffff0) + lVar21);
          puVar30 = puVar1 + 0x10;
          local_1140 = context->scene;
          ppfVar9 = (context->scene->vertices).items;
          pfVar10 = ppfVar9[*puVar30];
          pfVar6 = pfVar10 + *puVar1;
          fVar107 = *pfVar6;
          fVar146 = pfVar6[1];
          local_1138 = pfVar6[2];
          pfVar6 = pfVar10 + puVar1[4];
          fVar139 = *pfVar6;
          pfVar2 = pfVar10 + puVar1[8];
          fVar99 = *pfVar2;
          fVar100 = pfVar2[1];
          fVar133 = pfVar2[2];
          pfVar10 = pfVar10 + puVar1[0xc];
          pfVar11 = ppfVar9[puVar1[0x11]];
          pfVar2 = pfVar11 + puVar1[1];
          fVar110 = *pfVar2;
          fVar148 = pfVar2[1];
          fStack_1134 = pfVar2[2];
          pfVar2 = pfVar11 + puVar1[5];
          fVar141 = *pfVar2;
          pfVar3 = pfVar11 + puVar1[9];
          fVar103 = *pfVar3;
          fVar104 = pfVar3[1];
          fVar135 = pfVar3[2];
          pfVar11 = pfVar11 + puVar1[0xd];
          pfVar12 = ppfVar9[puVar1[0x12]];
          pfVar3 = pfVar12 + puVar1[2];
          fVar111 = *pfVar3;
          fVar150 = pfVar3[1];
          fStack_1130 = pfVar3[2];
          pfVar3 = pfVar12 + puVar1[6];
          fVar143 = *pfVar3;
          uVar16 = *(undefined8 *)(pfVar12 + puVar1[10]);
          uStack_1230 = *(undefined8 *)(pfVar12 + puVar1[10] + 2);
          uVar18 = uStack_1230;
          uVar17 = *(undefined8 *)(pfVar12 + puVar1[0xe]);
          pfVar24 = ppfVar9[puVar1[0x13]];
          pfVar4 = pfVar24 + puVar1[3];
          fVar131 = *pfVar4;
          fVar152 = pfVar4[1];
          fStack_112c = pfVar4[2];
          pfVar4 = pfVar24 + puVar1[7];
          fVar145 = *pfVar4;
          fVar105 = (pfVar24 + puVar1[0xb])[1];
          pfVar5 = pfVar24 + puVar1[0xf];
          local_1238._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fVar106 = local_1238._4_4_;
          local_1238 = (Geometry *)CONCAT44(fVar135,fVar133);
          local_11c8 = (Scene *)CONCAT44(fVar103,fVar99);
          local_11b8.valid = (int *)CONCAT44(pfVar24[puVar1[0xb]],(int)uVar16);
          local_11f8 = fVar100;
          fStack_11f4 = fVar104;
          fStack_11f0 = fVar106;
          fStack_11ec = fVar105;
          local_1268._0_4_ = (float)uVar17;
          local_1268._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_1260 = (float)*(undefined8 *)(pfVar12 + puVar1[0xe] + 2);
          fStack_f90 = pfVar3[1];
          fStack_f8c = pfVar4[1];
          fVar41 = fVar146 - pfVar6[1];
          fVar47 = fVar148 - pfVar2[1];
          fVar48 = fVar150 - pfVar3[1];
          fVar49 = fVar152 - pfVar4[1];
          local_f88 = CONCAT44(pfVar2[2],pfVar6[2]);
          local_f78._4_4_ = pfVar4[2];
          local_f78._0_4_ = pfVar3[2];
          fVar154 = local_1138 - pfVar6[2];
          fVar156 = fStack_1134 - pfVar2[2];
          fVar158 = fStack_1130 - pfVar3[2];
          fVar160 = fStack_112c - pfVar4[2];
          local_fb8 = pfVar10[1];
          fStack_fb4 = pfVar11[1];
          fStack_fb0 = local_1268._4_4_;
          fStack_fac = pfVar5[1];
          fVar132 = pfVar10[1] - fVar146;
          fVar134 = pfVar11[1] - fVar148;
          fVar136 = local_1268._4_4_ - fVar150;
          fVar137 = pfVar5[1] - fVar152;
          local_fa8 = CONCAT44(pfVar11[2],pfVar10[2]);
          local_f98 = fStack_1260;
          fStack_f94 = pfVar5[2];
          fVar138 = pfVar10[2] - local_1138;
          fVar140 = pfVar11[2] - fStack_1134;
          fVar142 = fStack_1260 - fStack_1130;
          fVar144 = pfVar5[2] - fStack_112c;
          fVar129 = fVar154 * fVar132 - fVar41 * fVar138;
          fVar66 = fVar156 * fVar134 - fVar47 * fVar140;
          fVar130 = fVar158 * fVar136 - fVar48 * fVar142;
          fVar69 = fVar160 * fVar137 - fVar49 * fVar144;
          local_fc8 = *pfVar10;
          fStack_fc4 = *pfVar11;
          fStack_fc0 = (float)local_1268;
          fStack_fbc = *pfVar5;
          fVar121 = *pfVar10 - fVar107;
          fVar122 = *pfVar11 - fVar110;
          fVar123 = (float)local_1268 - fVar111;
          fVar124 = *pfVar5 - fVar131;
          local_1228._4_4_ = (ray->super_RayK<1>).org.field_0.m128[0];
          local_1258._0_4_ = (ray->super_RayK<1>).org.field_0.m128[1];
          local_1278._4_4_ = (ray->super_RayK<1>).org.field_0.m128[2];
          local_1208._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
          local_11d8._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
          fVar115 = (ray->super_RayK<1>).dir.field_0.m128[2];
          local_1228._0_4_ = local_1228._4_4_;
          uStack_1220._0_4_ = (float)local_1228._4_4_;
          uStack_1220._4_4_ = (float)local_1228._4_4_;
          fVar112 = fVar107 - (float)local_1228._4_4_;
          fVar114 = fVar110 - (float)local_1228._4_4_;
          fStack_1060 = fVar111 - (float)local_1228._4_4_;
          fStack_105c = fVar131 - (float)local_1228._4_4_;
          local_1258._4_4_ = (float)local_1258;
          fStack_1250 = (float)local_1258;
          fStack_124c = (float)local_1258;
          fVar146 = fVar146 - (float)local_1258;
          fVar148 = fVar148 - (float)local_1258;
          fVar150 = fVar150 - (float)local_1258;
          fVar152 = fVar152 - (float)local_1258;
          fVar116 = fVar112 * (float)local_11d8 - fVar146 * (float)local_1208;
          fVar118 = fVar114 * (float)local_11d8 - fVar148 * (float)local_1208;
          fVar119 = fStack_1060 * (float)local_11d8 - fVar150 * (float)local_1208;
          fVar120 = fStack_105c * (float)local_11d8 - fVar152 * (float)local_1208;
          local_1268 = (Geometry *)CONCAT44(fVar141,fVar139);
          _fStack_1260 = CONCAT44(fVar145,fVar143);
          fVar107 = fVar107 - fVar139;
          fVar110 = fVar110 - fVar141;
          fVar111 = fVar111 - fVar143;
          fVar131 = fVar131 - fVar145;
          fVar91 = fVar107 * fVar138 - fVar154 * fVar121;
          fVar96 = fVar110 * fVar140 - fVar156 * fVar122;
          fVar97 = fVar111 * fVar142 - fVar158 * fVar123;
          fVar98 = fVar131 * fVar144 - fVar160 * fVar124;
          fStack_1270 = local_1278._4_4_;
          fStack_126c = local_1278._4_4_;
          local_1138 = local_1138 - local_1278._4_4_;
          fStack_1134 = fStack_1134 - local_1278._4_4_;
          fStack_1130 = fStack_1130 - local_1278._4_4_;
          fStack_112c = fStack_112c - local_1278._4_4_;
          local_1068 = (Geometry *)CONCAT44(fVar114,fVar112);
          fVar51 = local_1138 * (float)local_1208 - fVar112 * fVar115;
          fVar67 = fStack_1134 * (float)local_1208 - fVar114 * fVar115;
          fVar68 = fStack_1130 * (float)local_1208 - fStack_1060 * fVar115;
          fVar70 = fStack_112c * (float)local_1208 - fStack_105c * fVar115;
          fVar155 = fVar41 * fVar121 - fVar107 * fVar132;
          fVar157 = fVar47 * fVar122 - fVar110 * fVar134;
          fVar159 = fVar48 * fVar123 - fVar111 * fVar136;
          fVar161 = fVar49 * fVar124 - fVar131 * fVar137;
          fVar147 = fVar146 * fVar115 - local_1138 * (float)local_11d8;
          fVar149 = fVar148 * fVar115 - fStack_1134 * (float)local_11d8;
          fVar151 = fVar150 * fVar115 - fStack_1130 * (float)local_11d8;
          fVar153 = fVar152 * fVar115 - fStack_112c * (float)local_11d8;
          local_1188 = (Geometry *)CONCAT44(fVar115,fVar115);
          fStack_1180 = fVar115;
          fStack_117c = fVar115;
          local_11d8._4_4_ = (float)local_11d8;
          fStack_11d0 = (float)local_11d8;
          fStack_11cc = (float)local_11d8;
          local_1208._4_4_ = (float)local_1208;
          fStack_1200 = (float)local_1208;
          fStack_11fc = (float)local_1208;
          fVar125 = fVar129 * (float)local_1208 + fVar91 * (float)local_11d8 + fVar155 * fVar115;
          fVar126 = fVar66 * (float)local_1208 + fVar96 * (float)local_11d8 + fVar157 * fVar115;
          fVar127 = fVar130 * (float)local_1208 + fVar97 * (float)local_11d8 + fVar159 * fVar115;
          fVar128 = fVar69 * (float)local_1208 + fVar98 * (float)local_11d8 + fVar161 * fVar115;
          uVar37 = (uint)fVar125 & 0x80000000;
          uVar38 = (uint)fVar126 & 0x80000000;
          uVar39 = (uint)fVar127 & 0x80000000;
          uVar40 = (uint)fVar128 & 0x80000000;
          local_1128._0_4_ =
               (uint)(fVar121 * fVar147 + fVar132 * fVar51 + fVar138 * fVar116) ^ uVar37;
          local_1128._4_4_ =
               (uint)(fVar122 * fVar149 + fVar134 * fVar67 + fVar140 * fVar118) ^ uVar38;
          fStack_1120 = (float)((uint)(fVar123 * fVar151 + fVar136 * fVar68 + fVar142 * fVar119) ^
                               uVar39);
          fStack_111c = (float)((uint)(fVar124 * fVar153 + fVar137 * fVar70 + fVar144 * fVar120) ^
                               uVar40);
          local_1118 = (float)((uint)(fVar147 * fVar107 + fVar51 * fVar41 + fVar116 * fVar154) ^
                              uVar37);
          fStack_1114 = (float)((uint)(fVar149 * fVar110 + fVar67 * fVar47 + fVar118 * fVar156) ^
                               uVar38);
          fStack_1110 = (float)((uint)(fVar151 * fVar111 + fVar68 * fVar48 + fVar119 * fVar158) ^
                               uVar39);
          fStack_110c = (float)((uint)(fVar153 * fVar131 + fVar70 * fVar49 + fVar120 * fVar160) ^
                               uVar40);
          local_10f8._0_4_ = ABS(fVar125);
          local_10f8._4_4_ = ABS(fVar126);
          fStack_10f0 = ABS(fVar127);
          fStack_10ec = ABS(fVar128);
          auVar117._0_4_ =
               -(uint)((0.0 <= (float)local_1128._0_4_ && 0.0 <= local_1118) && fVar125 != 0.0) &
               local_fd8 & -(uint)((float)local_1128._0_4_ + local_1118 <= (float)local_10f8._0_4_);
          auVar117._4_4_ =
               -(uint)((0.0 <= (float)local_1128._4_4_ && 0.0 <= fStack_1114) && fVar126 != 0.0) &
               uStack_fd4 &
               -(uint)((float)local_1128._4_4_ + fStack_1114 <= (float)local_10f8._4_4_);
          auVar117._8_4_ =
               -(uint)((0.0 <= fStack_1120 && 0.0 <= fStack_1110) && fVar127 != 0.0) & uStack_fd0 &
               -(uint)(fStack_1120 + fStack_1110 <= fStack_10f0);
          auVar117._12_4_ =
               -(uint)((0.0 <= fStack_111c && 0.0 <= fStack_110c) && fVar128 != 0.0) & uStack_fcc &
               -(uint)(fStack_111c + fStack_110c <= fStack_10ec);
          lVar31 = ((ulong)pauVar35 & 0xfffffffffffffff0) + lVar21;
          iVar19 = movmskps((int)lVar21,auVar117);
          uStack_1230._4_4_ = (float)((ulong)uStack_1230 >> 0x20);
          context = local_11e0;
          fVar116 = (float)uStack_1230;
          fVar118 = uStack_1230._4_4_;
          if (iVar19 == 0) {
            local_1298 = 0.0;
          }
          else {
            local_1108._0_4_ =
                 uVar37 ^ (uint)(fVar112 * fVar129 + fVar146 * fVar91 + local_1138 * fVar155);
            local_1108._4_4_ =
                 uVar38 ^ (uint)(fVar114 * fVar66 + fVar148 * fVar96 + fStack_1134 * fVar157);
            fStack_1100 = (float)(uVar39 ^ (uint)(fStack_1060 * fVar130 +
                                                 fVar150 * fVar97 + fStack_1130 * fVar159));
            fStack_10fc = (float)(uVar40 ^ (uint)(fStack_105c * fVar69 +
                                                 fVar152 * fVar98 + fStack_112c * fVar161));
            fVar107 = (ray->super_RayK<1>).org.field_0.m128[3];
            fVar146 = (ray->super_RayK<1>).tfar;
            fVar110 = (float)(ray->super_RayK<1>).mask;
            fVar148 = (float)(ray->super_RayK<1>).id;
            fVar111 = (float)(ray->super_RayK<1>).flags;
            auVar56._0_4_ =
                 -(uint)(fVar107 * (float)local_10f8._0_4_ < (float)local_1108._0_4_ &&
                        (float)local_1108._0_4_ <= fVar146 * (float)local_10f8._0_4_) &
                 auVar117._0_4_;
            auVar56._4_4_ =
                 -(uint)(fVar107 * (float)local_10f8._4_4_ < (float)local_1108._4_4_ &&
                        (float)local_1108._4_4_ <= fVar146 * (float)local_10f8._4_4_) &
                 auVar117._4_4_;
            auVar56._8_4_ =
                 -(uint)(fVar107 * fStack_10f0 < fStack_1100 && fStack_1100 <= fVar146 * fStack_10f0
                        ) & auVar117._8_4_;
            auVar56._12_4_ =
                 -(uint)(fVar107 * fStack_10ec < fStack_10fc && fStack_10fc <= fVar146 * fStack_10ec
                        ) & auVar117._12_4_;
            local_1298 = (float)movmskps(iVar19,auVar56);
            if (local_1298 != 0.0) {
              local_10d8 = auVar56;
              local_1098._4_4_ = fVar66;
              local_1098._0_4_ = fVar129;
              local_1098._8_4_ = fVar130;
              local_1098._12_4_ = fVar69;
              local_1088 = CONCAT44(fVar96,fVar91);
              uStack_1080 = CONCAT44(fVar98,fVar97);
              local_1078 = CONCAT44(fVar157,fVar155);
              uStack_1070 = CONCAT44(fVar161,fVar159);
              local_1218 = auVar56;
              auVar15._4_4_ = local_10f8._4_4_;
              auVar15._0_4_ = local_10f8._0_4_;
              auVar15._8_4_ = fStack_10f0;
              auVar15._12_4_ = fStack_10ec;
              auVar71 = rcpps(local_1098,auVar15);
              fVar107 = auVar71._0_4_;
              fVar150 = auVar71._4_4_;
              fVar131 = auVar71._8_4_;
              fVar152 = auVar71._12_4_;
              fVar107 = (1.0 - (float)local_10f8._0_4_ * fVar107) * fVar107 + fVar107;
              fVar150 = (1.0 - (float)local_10f8._4_4_ * fVar150) * fVar150 + fVar150;
              fVar131 = (1.0 - fStack_10f0 * fVar131) * fVar131 + fVar131;
              fVar152 = (1.0 - fStack_10ec * fVar152) * fVar152 + fVar152;
              local_10a8._0_4_ = (float)local_1108._0_4_ * fVar107;
              local_10a8._4_4_ = (float)local_1108._4_4_ * fVar150;
              fStack_10a0 = fStack_1100 * fVar131;
              fStack_109c = fStack_10fc * fVar152;
              local_10c8[0] = (float)local_1128._0_4_ * fVar107;
              local_10c8[1] = (float)local_1128._4_4_ * fVar150;
              local_10c8[2] = fStack_1120 * fVar131;
              local_10c8[3] = fStack_111c * fVar152;
              local_10b8._4_4_ = fVar150 * fStack_1114;
              local_10b8._0_4_ = fVar107 * local_1118;
              fStack_10b0 = fVar131 * fStack_1110;
              fStack_10ac = fVar152 * fStack_110c;
              local_1228._4_4_ = local_10a8._4_4_;
              local_1228._0_4_ = local_10a8._0_4_;
              uStack_1220._0_4_ = fStack_10a0;
              uStack_1220._4_4_ = fStack_109c;
              auVar42._0_4_ = auVar56._0_4_ & local_10a8._0_4_;
              auVar42._4_4_ = auVar56._4_4_ & local_10a8._4_4_;
              auVar42._8_4_ = auVar56._8_4_ & (uint)fStack_10a0;
              auVar42._12_4_ = auVar56._12_4_ & (uint)fStack_109c;
              auVar77._0_8_ = CONCAT44(~auVar56._4_4_,~auVar56._0_4_) & 0x7f8000007f800000;
              auVar77._8_4_ = ~auVar56._8_4_ & 0x7f800000;
              auVar77._12_4_ = ~auVar56._12_4_ & 0x7f800000;
              auVar77 = auVar77 | auVar42;
              auVar87._4_4_ = auVar77._0_4_;
              auVar87._0_4_ = auVar77._4_4_;
              auVar87._8_4_ = auVar77._12_4_;
              auVar87._12_4_ = auVar77._8_4_;
              auVar71 = minps(auVar87,auVar77);
              auVar43._0_8_ = auVar71._8_8_;
              auVar43._8_4_ = auVar71._0_4_;
              auVar43._12_4_ = auVar71._4_4_;
              auVar71 = minps(auVar43,auVar71);
              auVar44._0_8_ =
                   CONCAT44(-(uint)(auVar71._4_4_ == auVar77._4_4_) & auVar56._4_4_,
                            -(uint)(auVar71._0_4_ == auVar77._0_4_) & auVar56._0_4_);
              auVar44._8_4_ = -(uint)(auVar71._8_4_ == auVar77._8_4_) & auVar56._8_4_;
              auVar44._12_4_ = -(uint)(auVar71._12_4_ == auVar77._12_4_) & auVar56._12_4_;
              iVar19 = movmskps(local_1298,auVar44);
              if (iVar19 != 0) {
                auVar56._8_4_ = auVar44._8_4_;
                auVar56._0_8_ = auVar44._0_8_;
                auVar56._12_4_ = auVar44._12_4_;
              }
              uVar23 = movmskps((int)pfVar24,auVar56);
              uVar36 = CONCAT44((int)((ulong)pfVar24 >> 0x20),uVar23);
              pGVar26 = (Geometry *)0x0;
              local_1258 = lVar31;
              fVar107 = fStack_11c0;
              fVar150 = fStack_11bc;
              local_1298 = fVar110;
              if (uVar36 != 0) {
                for (; (uVar36 >> (long)pGVar26 & 1) == 0;
                    pGVar26 = (Geometry *)((long)&(pGVar26->super_RefCount)._vptr_RefCount + 1)) {
                }
              }
LAB_0057db20:
              uStack_1230 = uVar18;
              local_1160 = puVar30[(long)pGVar26];
              local_1278 = (RayHit *)(ulong)local_1160;
              pGVar14 = (local_1140->geometries).items[local_1160].ptr;
              if ((pGVar14->mask & (uint)local_1298) == 0) {
                *(undefined4 *)(local_1218 + (long)pGVar26 * 4) = 0;
                goto LAB_0057db9c;
              }
              pGVar13 = (Geometry *)context->args;
              if (pGVar13->device == (Device *)0x0) {
                local_11b8.context = context->user;
                if (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                  fVar146 = local_10c8[(long)pGVar26];
                  fVar110 = *(float *)(local_10b8 + (long)pGVar26 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_10a8 + (long)pGVar26 * 4);
                  (ray->Ng).field_0.field_0.x = *(float *)(local_1098 + (long)pGVar26 * 4);
                  (ray->Ng).field_0.field_0.y = *(float *)((long)&local_1088 + (long)pGVar26 * 4);
                  (ray->Ng).field_0.field_0.z = *(float *)((long)&local_1078 + (long)pGVar26 * 4);
                  ray->u = fVar146;
                  ray->v = fVar110;
                  ray->primID = *(uint *)(local_1258 + 0x50 + (long)pGVar26 * 4);
                  ray->geomID = local_1160;
                  pfVar24 = (float *)(ulong)(local_11b8.context)->instID[0];
                  ray->instID[0] = (local_11b8.context)->instID[0];
                  local_1298 = (float)(local_11b8.context)->instPrimID[0];
                  ray->instPrimID[0] = (uint)local_1298;
LAB_0057e39c:
                  fStack_11bc = fVar150;
                  fStack_11c0 = fVar107;
                  local_1228._4_4_ = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
                  local_1278._4_4_ = (ray->super_RayK<1>).org.field_0.m128[2];
                  local_1208._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
                  local_11d8._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
                  fVar115 = (ray->super_RayK<1>).dir.field_0.m128[2];
                  local_1228._0_4_ = local_1228._4_4_;
                  uStack_1220._0_4_ = (float)local_1228._4_4_;
                  uStack_1220._4_4_ = (float)local_1228._4_4_;
                  local_1208._4_4_ = (float)local_1208;
                  fStack_1200 = (float)local_1208;
                  fStack_11fc = (float)local_1208;
                  local_11d8._4_4_ = (float)local_11d8;
                  fStack_11d0 = (float)local_11d8;
                  fStack_11cc = (float)local_11d8;
                  lVar31 = local_1258;
                  local_1258._4_4_ = (ray->super_RayK<1>).org.field_0.m128[1];
                  goto LAB_0057d7c8;
                }
                local_1188 = pGVar13;
                local_1138 = fVar146;
                fStack_1134 = fVar110;
                fStack_1130 = fVar148;
                fStack_112c = fVar111;
                local_11d8 = puVar30;
                local_1208 = uVar32;
              }
              else {
                local_1188 = pGVar13;
                local_1138 = fVar146;
                fStack_1134 = fVar110;
                fStack_1130 = fVar148;
                fStack_112c = fVar111;
                local_11d8 = puVar30;
                local_1208 = uVar32;
                local_11b8.context = context->user;
              }
              local_1178 = *(float *)(local_1098 + (long)pGVar26 * 4);
              local_1174 = *(undefined4 *)((long)&local_1088 + (long)pGVar26 * 4);
              local_1170 = *(undefined4 *)((long)&local_1078 + (long)pGVar26 * 4);
              local_116c = local_10c8[(long)pGVar26];
              local_1168 = *(undefined4 *)(local_10b8 + (long)pGVar26 * 4);
              local_1164 = *(undefined4 *)(local_1258 + 0x50 + (long)pGVar26 * 4);
              local_115c = (local_11b8.context)->instID[0];
              local_1158 = (local_11b8.context)->instPrimID[0];
              (ray->super_RayK<1>).tfar = *(float *)(local_10a8 + (long)pGVar26 * 4);
              local_127c = -1;
              local_11b8.valid = &local_127c;
              pGVar25 = (Geometry *)pGVar14->userPtr;
              local_11b8.geometryUserPtr = pGVar25;
              local_11b8.ray = (RTCRayN *)ray;
              local_11b8.hit = (RTCHitN *)&local_1178;
              local_11b8.N = 1;
              local_1068 = pGVar14;
              local_1278 = ray;
              local_1208 = uVar32;
              local_11d8 = puVar30;
              local_1188 = pGVar13;
              local_1138 = fVar146;
              fStack_1134 = fVar110;
              fStack_1130 = fVar148;
              fStack_112c = fVar111;
              if (((pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                  ((*pGVar14->intersectionFilterN)(&local_11b8), *local_11b8.valid != 0)) &&
                 ((local_1188->device == (Device *)0x0 ||
                  (((pGVar25 = local_1188,
                    ((ulong)(local_1188->super_RefCount)._vptr_RefCount & 2) == 0 &&
                    (pGVar25 = local_1068, ((local_1068->field_8).field_0x2 & 0x40) == 0)) ||
                   ((*(code *)local_1188->device)(&local_11b8), *local_11b8.valid != 0)))))) {
                (((Vec3f *)((long)local_11b8.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_11b8.hit;
                (((Vec3f *)((long)local_11b8.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_11b8.hit + 4);
                (((Vec3f *)((long)local_11b8.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_11b8.hit + 8);
                *(float *)((long)local_11b8.ray + 0x3c) = *(float *)(local_11b8.hit + 0xc);
                *(float *)((long)local_11b8.ray + 0x40) = *(float *)(local_11b8.hit + 0x10);
                *(float *)((long)local_11b8.ray + 0x44) = *(float *)(local_11b8.hit + 0x14);
                *(float *)((long)local_11b8.ray + 0x48) = *(float *)(local_11b8.hit + 0x18);
                *(float *)((long)local_11b8.ray + 0x4c) = *(float *)(local_11b8.hit + 0x1c);
                pGVar25 = (Geometry *)(ulong)(uint)*(float *)(local_11b8.hit + 0x20);
                *(float *)((long)local_11b8.ray + 0x50) = *(float *)(local_11b8.hit + 0x20);
              }
              else {
                (local_1278->super_RayK<1>).tfar = local_1138;
              }
              *(undefined4 *)(local_1218 + (long)pGVar26 * 4) = 0;
              fVar146 = (local_1278->super_RayK<1>).tfar;
              fVar110 = (float)(local_1278->super_RayK<1>).mask;
              fVar148 = (float)(local_1278->super_RayK<1>).id;
              fVar111 = (float)(local_1278->super_RayK<1>).flags;
              local_1218._0_4_ = -(uint)((float)local_1228._0_4_ <= fVar146) & local_1218._0_4_;
              local_1218._4_4_ = -(uint)((float)local_1228._4_4_ <= fVar146) & local_1218._4_4_;
              local_1218._8_4_ = -(uint)((float)uStack_1220 <= fVar146) & local_1218._8_4_;
              local_1218._12_4_ = -(uint)(uStack_1220._4_4_ <= fVar146) & local_1218._12_4_;
              local_1298 = (float)(local_1278->super_RayK<1>).mask;
              pGVar26 = pGVar25;
              context = local_11e0;
              ray = local_1278;
              uVar29 = local_1240;
              puVar30 = local_11d8;
              uVar32 = local_1208;
              fVar133 = (float)local_1238;
              fVar135 = local_1238._4_4_;
              fVar116 = (float)uStack_1230;
              fVar118 = uStack_1230._4_4_;
              fVar139 = (float)local_1268;
              fVar141 = local_1268._4_4_;
              fVar143 = fStack_1260;
              fVar145 = fStack_125c;
              fVar99 = (float)local_11c8;
              fVar103 = local_11c8._4_4_;
              fVar107 = fStack_11c0;
              fVar150 = fStack_11bc;
              fVar100 = local_11f8;
              fVar104 = fStack_11f4;
              fVar106 = fStack_11f0;
              fVar105 = fStack_11ec;
LAB_0057db9c:
              uVar23 = (undefined4)((ulong)pGVar26 >> 0x20);
              iVar19 = movmskps((int)pGVar26,local_1218);
              pfVar24 = (float *)CONCAT44(uVar23,iVar19);
              if (iVar19 == 0) goto LAB_0057e39c;
              uVar37 = local_1218._0_4_;
              auVar57._0_4_ = local_1228._0_4_ & uVar37;
              uVar38 = local_1218._4_4_;
              auVar57._4_4_ = local_1228._4_4_ & uVar38;
              uVar39 = local_1218._8_4_;
              auVar57._8_4_ = (uint)(float)uStack_1220 & uVar39;
              uVar40 = local_1218._12_4_;
              auVar57._12_4_ = (uint)uStack_1220._4_4_ & uVar40;
              auVar78._0_8_ = CONCAT44(~uVar38,~uVar37) & 0x7f8000007f800000;
              auVar78._8_4_ = ~uVar39 & 0x7f800000;
              auVar78._12_4_ = ~uVar40 & 0x7f800000;
              auVar78 = auVar78 | auVar57;
              auVar88._4_4_ = auVar78._0_4_;
              auVar88._0_4_ = auVar78._4_4_;
              auVar88._8_4_ = auVar78._12_4_;
              auVar88._12_4_ = auVar78._8_4_;
              auVar71 = minps(auVar88,auVar78);
              auVar58._0_8_ = auVar71._8_8_;
              auVar58._8_4_ = auVar71._0_4_;
              auVar58._12_4_ = auVar71._4_4_;
              auVar71 = minps(auVar58,auVar71);
              auVar59._0_8_ =
                   CONCAT44(-(uint)(auVar71._4_4_ == auVar78._4_4_) & uVar38,
                            -(uint)(auVar71._0_4_ == auVar78._0_4_) & uVar37);
              auVar59._8_4_ = -(uint)(auVar71._8_4_ == auVar78._8_4_) & uVar39;
              auVar59._12_4_ = -(uint)(auVar71._12_4_ == auVar78._12_4_) & uVar40;
              iVar19 = movmskps(iVar19,auVar59);
              auVar45 = local_1218;
              if (iVar19 != 0) {
                auVar45._8_4_ = auVar59._8_4_;
                auVar45._0_8_ = auVar59._0_8_;
                auVar45._12_4_ = auVar59._12_4_;
              }
              uVar22 = movmskps(iVar19,auVar45);
              uVar36 = CONCAT44(uVar23,uVar22);
              pGVar26 = (Geometry *)0x0;
              uVar18 = uStack_1230;
              if (uVar36 != 0) {
                for (; (uVar36 >> (long)pGVar26 & 1) == 0;
                    pGVar26 = (Geometry *)((long)&(pGVar26->super_RefCount)._vptr_RefCount + 1)) {
                }
              }
              goto LAB_0057db20;
            }
          }
LAB_0057d7c8:
          fVar107 = fVar99 - local_fc8;
          fVar146 = fVar103 - fStack_fc4;
          fVar110 = fStack_11c0 - fStack_fc0;
          fVar148 = fStack_11bc - fStack_fbc;
          fVar70 = fVar100 - local_fb8;
          fVar97 = fVar104 - fStack_fb4;
          fVar98 = fVar106 - fStack_fb0;
          fVar124 = fVar105 - fStack_fac;
          fVar121 = fVar133 - (float)local_fa8;
          fVar122 = fVar135 - local_fa8._4_4_;
          fVar123 = fVar116 - fStack_fa0;
          fVar125 = fVar118 - fStack_f9c;
          fVar139 = fVar139 - fVar99;
          fVar141 = fVar141 - fVar103;
          fVar143 = fVar143 - fStack_11c0;
          fVar145 = fVar145 - fStack_11bc;
          fVar112 = local_f98 - fVar100;
          fVar114 = fStack_f94 - fVar104;
          fVar119 = fStack_f90 - fVar106;
          fVar120 = fStack_f8c - fVar105;
          local_1268 = (Geometry *)CONCAT44(fVar141,fVar139);
          _fStack_1260 = CONCAT44(fVar145,fVar143);
          fVar111 = (float)local_f88 - fVar133;
          fVar150 = local_f88._4_4_ - fVar135;
          fVar131 = fStack_f80 - fVar116;
          fVar152 = fStack_f7c - fVar118;
          fVar91 = fVar112 * fVar121 - fVar111 * fVar70;
          fVar96 = fVar114 * fVar122 - fVar150 * fVar97;
          fStack_1270 = fVar119 * fVar123 - fVar131 * fVar98;
          fStack_126c = fVar120 * fVar125 - fVar152 * fVar124;
          fVar128 = fVar111 * fVar107 - fVar139 * fVar121;
          fVar132 = fVar150 * fVar146 - fVar141 * fVar122;
          fVar134 = fVar131 * fVar110 - fVar143 * fVar123;
          fVar136 = fVar152 * fVar148 - fVar145 * fVar125;
          fVar126 = fVar139 * fVar70 - fVar112 * fVar107;
          fVar127 = fVar141 * fVar97 - fVar114 * fVar146;
          fStack_1250 = fVar143 * fVar98 - fVar119 * fVar110;
          fStack_124c = fVar145 * fVar124 - fVar120 * fVar148;
          fVar99 = fVar99 - (float)local_1228._0_4_;
          fVar103 = fVar103 - (float)local_1228._4_4_;
          fStack_11c0 = fStack_11c0 - (float)uStack_1220;
          fStack_11bc = fStack_11bc - uStack_1220._4_4_;
          local_11f8 = fVar100 - local_1258._4_4_;
          fStack_11f4 = fVar104 - local_1258._4_4_;
          fStack_11f0 = fVar106 - local_1258._4_4_;
          fStack_11ec = fVar105 - local_1258._4_4_;
          fVar133 = fVar133 - local_1278._4_4_;
          fVar135 = fVar135 - local_1278._4_4_;
          fVar116 = fVar116 - local_1278._4_4_;
          fVar118 = fVar118 - local_1278._4_4_;
          local_1238 = (Geometry *)CONCAT44(fVar135,fVar133);
          uStack_1230 = CONCAT44(fVar118,fVar116);
          fVar67 = local_11f8 * fVar115 - fVar133 * local_11d8._4_4_;
          fVar130 = fStack_11f4 * fVar115 - fVar135 * local_11d8._4_4_;
          fVar68 = fStack_11f0 * fVar115 - fVar116 * local_11d8._4_4_;
          fVar69 = fStack_11ec * fVar115 - fVar118 * local_11d8._4_4_;
          fVar41 = fVar133 * local_1208._4_4_ - fVar99 * fVar115;
          fVar47 = fVar135 * local_1208._4_4_ - fVar103 * fVar115;
          fVar48 = fVar116 * local_1208._4_4_ - fStack_11c0 * fVar115;
          fVar49 = fVar118 * local_1208._4_4_ - fStack_11bc * fVar115;
          local_11c8 = (Scene *)CONCAT44(fVar103,fVar99);
          fVar100 = fVar99 * local_11d8._4_4_ - local_11f8 * local_1208._4_4_;
          fVar104 = fVar103 * local_11d8._4_4_ - fStack_11f4 * local_1208._4_4_;
          fVar105 = fStack_11c0 * local_11d8._4_4_ - fStack_11f0 * local_1208._4_4_;
          fVar106 = fStack_11bc * local_11d8._4_4_ - fStack_11ec * local_1208._4_4_;
          local_1258 = CONCAT44(fVar127,fVar126);
          local_1228._4_4_ = fVar132;
          local_1228._0_4_ = fVar128;
          uStack_1220._0_4_ = fVar134;
          uStack_1220._4_4_ = fVar136;
          local_1278 = (RayHit *)CONCAT44(fVar96,fVar91);
          fVar129 = local_1208._4_4_ * fVar91 + local_11d8._4_4_ * fVar128 + fVar115 * fVar126;
          fVar51 = local_1208._4_4_ * fVar96 + local_11d8._4_4_ * fVar132 + fVar115 * fVar127;
          fVar66 = local_1208._4_4_ * fStack_1270 +
                   local_11d8._4_4_ * fVar134 + fVar115 * fStack_1250;
          fVar115 = local_1208._4_4_ * fStack_126c +
                    local_11d8._4_4_ * fVar136 + fVar115 * fStack_124c;
          uVar37 = (uint)fVar129 & 0x80000000;
          uVar38 = (uint)fVar51 & 0x80000000;
          uVar39 = (uint)fVar66 & 0x80000000;
          uVar40 = (uint)fVar115 & 0x80000000;
          fVar112 = (float)((uint)(fVar139 * fVar67 + fVar112 * fVar41 + fVar111 * fVar100) ^ uVar37
                           );
          fVar114 = (float)((uint)(fVar141 * fVar130 + fVar114 * fVar47 + fVar150 * fVar104) ^
                           uVar38);
          fVar119 = (float)((uint)(fVar143 * fVar68 + fVar119 * fVar48 + fVar131 * fVar105) ^ uVar39
                           );
          fVar120 = (float)((uint)(fVar145 * fVar69 + fVar120 * fVar49 + fVar152 * fVar106) ^ uVar40
                           );
          fVar121 = (float)((uint)(fVar67 * fVar107 + fVar41 * fVar70 + fVar100 * fVar121) ^ uVar37)
          ;
          fVar122 = (float)((uint)(fVar130 * fVar146 + fVar47 * fVar97 + fVar104 * fVar122) ^ uVar38
                           );
          fVar123 = (float)((uint)(fVar68 * fVar110 + fVar48 * fVar98 + fVar105 * fVar123) ^ uVar39)
          ;
          fVar124 = (float)((uint)(fVar69 * fVar148 + fVar49 * fVar124 + fVar106 * fVar125) ^ uVar40
                           );
          fVar97 = ABS(fVar129);
          fVar98 = ABS(fVar51);
          local_10f8 = (undefined1  [8])(CONCAT44(fVar51,fVar129) & 0x7fffffff7fffffff);
          fStack_10f0 = ABS(fVar66);
          fStack_10ec = ABS(fVar115);
          auVar86._0_4_ =
               -(uint)((0.0 <= fVar112 && 0.0 <= fVar121) && fVar129 != 0.0) & local_fd8 &
               -(uint)(fVar112 + fVar121 <= fVar97);
          auVar86._4_4_ =
               -(uint)((0.0 <= fVar114 && 0.0 <= fVar122) && fVar51 != 0.0) & uStack_fd4 &
               -(uint)(fVar114 + fVar122 <= fVar98);
          auVar86._8_4_ =
               -(uint)((0.0 <= fVar119 && 0.0 <= fVar123) && fVar66 != 0.0) & uStack_fd0 &
               -(uint)(fVar119 + fVar123 <= fStack_10f0);
          auVar86._12_4_ =
               -(uint)((0.0 <= fVar120 && 0.0 <= fVar124) && fVar115 != 0.0) & uStack_fcc &
               -(uint)(fVar120 + fVar124 <= fStack_10ec);
          iVar19 = movmskps(local_1298,auVar86);
          fVar139 = local_fe8;
          fVar100 = fStack_fe4;
          fVar110 = fStack_fe0;
          fVar148 = fStack_fdc;
          fVar150 = local_ff8;
          fVar104 = fStack_ff4;
          fVar111 = fStack_ff0;
          fVar143 = fStack_fec;
          fVar131 = local_1008;
          fVar152 = fStack_1004;
          fVar145 = fStack_1000;
          fVar105 = fStack_ffc;
          fVar107 = local_1018;
          fVar115 = fStack_1014;
          fVar106 = fStack_1010;
          fVar41 = fStack_100c;
          fVar146 = local_1028;
          fVar47 = fStack_1024;
          fVar48 = fStack_1020;
          fVar49 = fStack_101c;
          fVar129 = local_1038;
          fVar51 = fStack_1034;
          fVar66 = fStack_1030;
          fVar67 = fStack_102c;
          fVar130 = local_1048;
          fVar68 = fStack_1044;
          fVar69 = fStack_1040;
          fVar70 = fStack_103c;
          if (iVar19 != 0) {
            local_1108._0_4_ =
                 uVar37 ^ (uint)(fVar99 * fVar91 + local_11f8 * fVar128 + fVar133 * fVar126);
            local_1108._4_4_ =
                 uVar38 ^ (uint)(fVar103 * fVar96 + fStack_11f4 * fVar132 + fVar135 * fVar127);
            fStack_1100 = (float)(uVar39 ^ (uint)(fStack_11c0 * fStack_1270 +
                                                 fStack_11f0 * fVar134 + fVar116 * fStack_1250));
            fStack_10fc = (float)(uVar40 ^ (uint)(fStack_11bc * fStack_126c +
                                                 fStack_11ec * fVar136 + fVar118 * fStack_124c));
            fVar99 = (ray->super_RayK<1>).org.field_0.m128[3];
            local_11f8 = (ray->super_RayK<1>).tfar;
            fStack_11f4 = (float)(ray->super_RayK<1>).mask;
            auVar113._0_4_ =
                 -(uint)((float)local_1108._0_4_ <= local_11f8 * fVar97 &&
                        fVar99 * fVar97 < (float)local_1108._0_4_) & auVar86._0_4_;
            auVar113._4_4_ =
                 -(uint)((float)local_1108._4_4_ <= local_11f8 * fVar98 &&
                        fVar99 * fVar98 < (float)local_1108._4_4_) & auVar86._4_4_;
            auVar113._8_4_ =
                 -(uint)(fStack_1100 <= local_11f8 * fStack_10f0 &&
                        fVar99 * fStack_10f0 < fStack_1100) & auVar86._8_4_;
            auVar113._12_4_ =
                 -(uint)(fStack_10fc <= local_11f8 * fStack_10ec &&
                        fVar99 * fStack_10ec < fStack_10fc) & auVar86._12_4_;
            iVar19 = movmskps(iVar19,auVar113);
            if (iVar19 != 0) {
              fStack_11f0 = (float)(ray->super_RayK<1>).id;
              fStack_11ec = (float)(ray->super_RayK<1>).flags;
              local_10d8 = auVar113;
              local_1098._12_4_ = fStack_126c;
              local_1098._8_4_ = fStack_1270;
              local_1098._0_8_ = local_1278;
              local_1088 = local_1228;
              uStack_1080 = uStack_1220;
              local_1078 = local_1258;
              uStack_1070 = CONCAT44(fStack_124c,fStack_1250);
              local_1128._4_4_ = fVar98 - fVar114;
              local_1128._0_4_ = fVar97 - fVar112;
              fStack_1120 = fStack_10f0 - fVar119;
              fStack_111c = fStack_10ec - fVar120;
              local_1118 = fVar97 - fVar121;
              fStack_1114 = fVar98 - fVar122;
              fStack_1110 = fStack_10f0 - fVar123;
              fStack_110c = fStack_10ec - fVar124;
              local_1218 = auVar113;
              auVar71 = rcpps(_local_1108,_local_10f8);
              fVar99 = auVar71._0_4_;
              fVar133 = auVar71._4_4_;
              fVar103 = auVar71._8_4_;
              fVar135 = auVar71._12_4_;
              fVar99 = (1.0 - fVar97 * fVar99) * fVar99 + fVar99;
              fVar133 = (1.0 - fVar98 * fVar133) * fVar133 + fVar133;
              fVar103 = (1.0 - fStack_10f0 * fVar103) * fVar103 + fVar103;
              fVar135 = (1.0 - fStack_10ec * fVar135) * fVar135 + fVar135;
              local_10a8 = (undefined1  [8])
                           CONCAT44((float)local_1108._4_4_ * fVar133,
                                    (float)local_1108._0_4_ * fVar99);
              fStack_10a0 = fStack_1100 * fVar103;
              fStack_109c = fStack_10fc * fVar135;
              local_10c8[0] = (fVar97 - fVar112) * fVar99;
              local_10c8[1] = (fVar98 - fVar114) * fVar133;
              local_10c8[2] = (fStack_10f0 - fVar119) * fVar103;
              local_10c8[3] = (fStack_10ec - fVar120) * fVar135;
              local_10b8._0_4_ = fVar99 * (fVar97 - fVar121);
              local_10b8._4_4_ = fVar133 * (fVar98 - fVar122);
              fStack_10b0 = fVar103 * (fStack_10f0 - fVar123);
              fStack_10ac = fVar135 * (fStack_10ec - fVar124);
              auVar60._0_4_ = auVar113._0_4_ & (uint)((float)local_1108._0_4_ * fVar99);
              auVar60._4_4_ = auVar113._4_4_ & (uint)((float)local_1108._4_4_ * fVar133);
              auVar60._8_4_ = auVar113._8_4_ & (uint)fStack_10a0;
              auVar60._12_4_ = auVar113._12_4_ & (uint)fStack_109c;
              auVar79._0_8_ = CONCAT44(~auVar113._4_4_,~auVar113._0_4_) & 0x7f8000007f800000;
              auVar79._8_4_ = ~auVar113._8_4_ & 0x7f800000;
              auVar79._12_4_ = ~auVar113._12_4_ & 0x7f800000;
              auVar79 = auVar79 | auVar60;
              auVar89._4_4_ = auVar79._0_4_;
              auVar89._0_4_ = auVar79._4_4_;
              auVar89._8_4_ = auVar79._12_4_;
              auVar89._12_4_ = auVar79._8_4_;
              auVar71 = minps(auVar89,auVar79);
              auVar61._0_8_ = auVar71._8_8_;
              auVar61._8_4_ = auVar71._0_4_;
              auVar61._12_4_ = auVar71._4_4_;
              auVar71 = minps(auVar61,auVar71);
              auVar62._0_8_ =
                   CONCAT44(-(uint)(auVar71._4_4_ == auVar79._4_4_) & auVar113._4_4_,
                            -(uint)(auVar71._0_4_ == auVar79._0_4_) & auVar113._0_4_);
              auVar62._8_4_ = -(uint)(auVar71._8_4_ == auVar79._8_4_) & auVar113._8_4_;
              auVar62._12_4_ = -(uint)(auVar71._12_4_ == auVar79._12_4_) & auVar113._12_4_;
              iVar19 = movmskps(iVar19,auVar62);
              uStack_1220._0_4_ = fStack_10a0;
              local_1228 = local_10a8;
              uStack_1220._4_4_ = fStack_109c;
              if (iVar19 != 0) {
                auVar113._8_4_ = auVar62._8_4_;
                auVar113._0_8_ = auVar62._0_8_;
                auVar113._12_4_ = auVar62._12_4_;
              }
              local_1268 = (Geometry *)CONCAT44(fVar141,fStack_11f4);
              uVar23 = movmskps((int)pfVar24,auVar113);
              uVar36 = CONCAT44((int)((ulong)pfVar24 >> 0x20),uVar23);
              pGVar26 = (Geometry *)0x0;
              if (uVar36 != 0) {
                for (; (uVar36 >> (long)pGVar26 & 1) == 0;
                    pGVar26 = (Geometry *)((long)&(pGVar26->super_RefCount)._vptr_RefCount + 1)) {
                }
              }
              local_11c8 = context->scene;
              local_1278 = ray;
              local_1258 = lVar31;
              fStack_1200 = local_1208._4_4_;
              fStack_11fc = local_1208._4_4_;
              fStack_11d0 = local_11d8._4_4_;
              fStack_11cc = local_11d8._4_4_;
              do {
                local_1160 = puVar30[(long)pGVar26];
                local_1238 = (Geometry *)(ulong)local_1160;
                local_1238 = (local_11c8->geometries).items[local_1160].ptr;
                if ((local_1238->mask & (uint)(float)local_1268) == 0) {
                  *(undefined4 *)(local_1218 + (long)pGVar26 * 4) = 0;
                  uVar37 = (uint)(float)local_1268;
                }
                else {
                  local_1268 = pGVar26;
                  pGVar14 = (Geometry *)context->args;
                  if (pGVar14->device == (Device *)0x0) {
                    local_11b8.context = context->user;
                    if (local_1238->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      fVar99 = local_10c8[(long)pGVar26];
                      fVar133 = *(float *)(local_10b8 + (long)pGVar26 * 4);
                      (local_1278->super_RayK<1>).tfar = *(float *)(local_10a8 + (long)pGVar26 * 4);
                      (local_1278->Ng).field_0.field_0.x =
                           *(float *)(local_1098 + (long)pGVar26 * 4);
                      (local_1278->Ng).field_0.field_0.y =
                           *(float *)((long)&local_1088 + (long)pGVar26 * 4);
                      (local_1278->Ng).field_0.field_0.z =
                           *(float *)((long)&local_1078 + (long)pGVar26 * 4);
                      local_1278->u = fVar99;
                      local_1278->v = fVar133;
                      local_1278->primID = *(uint *)(local_1258 + 0x50 + (long)pGVar26 * 4);
                      local_1278->geomID = local_1160;
                      local_1278->instID[0] = (local_11b8.context)->instID[0];
                      local_1278->instPrimID[0] = (local_11b8.context)->instPrimID[0];
                      ray = local_1278;
                      break;
                    }
                    local_11d8 = puVar30;
                    local_1208 = uVar32;
                  }
                  else {
                    local_11d8 = puVar30;
                    local_1208 = uVar32;
                    local_11b8.context = context->user;
                  }
                  local_1178 = *(float *)(local_1098 + (long)pGVar26 * 4);
                  local_1174 = *(undefined4 *)((long)&local_1088 + (long)pGVar26 * 4);
                  local_1170 = *(undefined4 *)((long)&local_1078 + (long)pGVar26 * 4);
                  local_116c = local_10c8[(long)pGVar26];
                  local_1168 = *(undefined4 *)(local_10b8 + (long)pGVar26 * 4);
                  local_1164 = *(undefined4 *)(local_1258 + 0x50 + (long)pGVar26 * 4);
                  local_115c = (local_11b8.context)->instID[0];
                  local_1158 = (local_11b8.context)->instPrimID[0];
                  (local_1278->super_RayK<1>).tfar = *(float *)(local_10a8 + (long)pGVar26 * 4);
                  local_127c = -1;
                  local_11b8.valid = &local_127c;
                  pGVar26 = (Geometry *)local_1238->userPtr;
                  local_11b8.geometryUserPtr = pGVar26;
                  local_11b8.ray = (RTCRayN *)local_1278;
                  local_11b8.hit = (RTCHitN *)&local_1178;
                  local_11b8.N = 1;
                  local_1208 = uVar32;
                  local_11d8 = puVar30;
                  if (((local_1238->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                      ((*local_1238->intersectionFilterN)(&local_11b8), *local_11b8.valid != 0)) &&
                     (((pGVar14->device == (Device *)0x0 ||
                       ((pGVar26 = pGVar14,
                        ((ulong)(pGVar14->super_RefCount)._vptr_RefCount & 2) == 0 &&
                        (pGVar26 = local_1238, ((local_1238->field_8).field_0x2 & 0x40) == 0)))) ||
                      ((*(code *)pGVar14->device)(&local_11b8), *local_11b8.valid != 0)))) {
                    (((Vec3f *)((long)local_11b8.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_11b8.hit;
                    (((Vec3f *)((long)local_11b8.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_11b8.hit + 4);
                    (((Vec3f *)((long)local_11b8.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_11b8.hit + 8);
                    *(float *)((long)local_11b8.ray + 0x3c) = *(float *)(local_11b8.hit + 0xc);
                    *(float *)((long)local_11b8.ray + 0x40) = *(float *)(local_11b8.hit + 0x10);
                    *(float *)((long)local_11b8.ray + 0x44) = *(float *)(local_11b8.hit + 0x14);
                    *(float *)((long)local_11b8.ray + 0x48) = *(float *)(local_11b8.hit + 0x18);
                    *(float *)((long)local_11b8.ray + 0x4c) = *(float *)(local_11b8.hit + 0x1c);
                    pGVar26 = (Geometry *)(ulong)(uint)*(float *)(local_11b8.hit + 0x20);
                    *(float *)((long)local_11b8.ray + 0x50) = *(float *)(local_11b8.hit + 0x20);
                  }
                  else {
                    (local_1278->super_RayK<1>).tfar = local_11f8;
                  }
                  *(undefined4 *)(local_1218 + (long)local_1268 * 4) = 0;
                  local_11f8 = (local_1278->super_RayK<1>).tfar;
                  fStack_11f4 = (float)(local_1278->super_RayK<1>).mask;
                  fStack_11f0 = (float)(local_1278->super_RayK<1>).id;
                  fStack_11ec = (float)(local_1278->super_RayK<1>).flags;
                  local_1218._0_4_ = -(uint)(local_1228._0_4_ <= local_11f8) & local_1218._0_4_;
                  local_1218._4_4_ = -(uint)(local_1228._4_4_ <= local_11f8) & local_1218._4_4_;
                  local_1218._8_4_ = -(uint)(local_1228._8_4_ <= local_11f8) & local_1218._8_4_;
                  local_1218._12_4_ = -(uint)(local_1228._12_4_ <= local_11f8) & local_1218._12_4_;
                  context = local_11e0;
                  uVar29 = local_1240;
                  puVar30 = local_11d8;
                  uVar32 = local_1208;
                  fVar139 = local_fe8;
                  fVar100 = fStack_fe4;
                  fVar110 = fStack_fe0;
                  fVar148 = fStack_fdc;
                  fVar150 = local_ff8;
                  fVar104 = fStack_ff4;
                  fVar111 = fStack_ff0;
                  fVar143 = fStack_fec;
                  fVar131 = local_1008;
                  fVar152 = fStack_1004;
                  fVar145 = fStack_1000;
                  fVar105 = fStack_ffc;
                  fVar107 = local_1018;
                  fVar115 = fStack_1014;
                  fVar106 = fStack_1010;
                  fVar41 = fStack_100c;
                  fVar146 = local_1028;
                  fVar47 = fStack_1024;
                  fVar48 = fStack_1020;
                  fVar49 = fStack_101c;
                  fVar129 = local_1038;
                  fVar51 = fStack_1034;
                  fVar66 = fStack_1030;
                  fVar67 = fStack_102c;
                  fVar130 = local_1048;
                  fVar68 = fStack_1044;
                  fVar69 = fStack_1040;
                  fVar70 = fStack_103c;
                  uVar37 = (local_1278->super_RayK<1>).mask;
                }
                iVar19 = movmskps((int)pGVar26,local_1218);
                ray = local_1278;
                if (iVar19 == 0) break;
                uVar38 = local_1218._0_4_;
                auVar63._0_4_ = local_1228._0_4_ & uVar38;
                uVar39 = local_1218._4_4_;
                auVar63._4_4_ = local_1228._4_4_ & uVar39;
                uVar40 = local_1218._8_4_;
                auVar63._8_4_ = local_1228._8_4_ & uVar40;
                uVar50 = local_1218._12_4_;
                auVar63._12_4_ = local_1228._12_4_ & uVar50;
                auVar80._0_8_ = CONCAT44(~uVar39,~uVar38) & 0x7f8000007f800000;
                auVar80._8_4_ = ~uVar40 & 0x7f800000;
                auVar80._12_4_ = ~uVar50 & 0x7f800000;
                auVar80 = auVar80 | auVar63;
                auVar90._4_4_ = auVar80._0_4_;
                auVar90._0_4_ = auVar80._4_4_;
                auVar90._8_4_ = auVar80._12_4_;
                auVar90._12_4_ = auVar80._8_4_;
                auVar71 = minps(auVar90,auVar80);
                auVar64._0_8_ = auVar71._8_8_;
                auVar64._8_4_ = auVar71._0_4_;
                auVar64._12_4_ = auVar71._4_4_;
                auVar71 = minps(auVar64,auVar71);
                auVar65._0_8_ =
                     CONCAT44(-(uint)(auVar71._4_4_ == auVar80._4_4_) & uVar39,
                              -(uint)(auVar71._0_4_ == auVar80._0_4_) & uVar38);
                auVar65._8_4_ = -(uint)(auVar71._8_4_ == auVar80._8_4_) & uVar40;
                auVar65._12_4_ = -(uint)(auVar71._12_4_ == auVar80._12_4_) & uVar50;
                iVar19 = movmskps(iVar19,auVar65);
                auVar46 = local_1218;
                if (iVar19 != 0) {
                  auVar46._8_4_ = auVar65._8_4_;
                  auVar46._0_8_ = auVar65._0_8_;
                  auVar46._12_4_ = auVar65._12_4_;
                }
                uVar23 = movmskps(iVar19,auVar46);
                uVar36 = CONCAT44((int)((ulong)pGVar26 >> 0x20),uVar23);
                pGVar26 = (Geometry *)0x0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> (long)pGVar26 & 1) == 0;
                      pGVar26 = (Geometry *)((long)&(pGVar26->super_RefCount)._vptr_RefCount + 1)) {
                  }
                }
                local_1268 = (Geometry *)CONCAT44(local_1268._4_4_,uVar37);
              } while( true );
            }
          }
        }
        fVar99 = (ray->super_RayK<1>).tfar;
        auVar71._4_4_ = fVar99;
        auVar71._0_4_ = fVar99;
        auVar71._8_4_ = fVar99;
        auVar71._12_4_ = fVar99;
      }
      goto LAB_0057d0b4;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }